

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::DefUseManager::WhileEachUser
          (DefUseManager *this,Instruction *def,function<bool_(spvtools::opt::Instruction_*)> *f)

{
  bool bVar1;
  uint32_t id;
  Instruction *pIVar2;
  pointer pUVar3;
  const_iterator local_38;
  const_iterator iter;
  iterator end;
  function<bool_(spvtools::opt::Instruction_*)> *f_local;
  Instruction *def_local;
  DefUseManager *this_local;
  
  bVar1 = false;
  if (def != (Instruction *)0x0) {
    bVar1 = opt::Instruction::HasResultId(def);
    if (bVar1) {
      id = opt::Instruction::result_id(def);
      pIVar2 = GetDef(this,id);
      bVar1 = false;
      if (def != pIVar2) goto LAB_0099630b;
    }
    bVar1 = true;
  }
LAB_0099630b:
  if (!bVar1) {
    __assert_fail("def && (!def->HasResultId() || def == GetDef(def->result_id())) && \"Definition is not registered.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/def_use_manager.cpp"
                  ,0x76,
                  "bool spvtools::opt::analysis::DefUseManager::WhileEachUser(const Instruction *, const std::function<bool (Instruction *)> &) const"
                 );
  }
  bVar1 = opt::Instruction::HasResultId(def);
  if (bVar1) {
    iter._M_node = (_Base_ptr)
                   std::
                   set<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
                   ::end(&this->id_to_users_);
    local_38 = UsersBegin(this,def);
    while (bVar1 = UsersNotEnd(this,&local_38,&iter,def), bVar1) {
      pUVar3 = std::_Rb_tree_const_iterator<spvtools::opt::analysis::UserEntry>::operator->
                         (&local_38);
      bVar1 = std::function<bool_(spvtools::opt::Instruction_*)>::operator()(f,pUVar3->user);
      if (!bVar1) {
        return false;
      }
      std::_Rb_tree_const_iterator<spvtools::opt::analysis::UserEntry>::operator++(&local_38);
    }
  }
  return true;
}

Assistant:

bool DefUseManager::WhileEachUser(
    const Instruction* def, const std::function<bool(Instruction*)>& f) const {
  // Ensure that |def| has been registered.
  assert(def && (!def->HasResultId() || def == GetDef(def->result_id())) &&
         "Definition is not registered.");
  if (!def->HasResultId()) return true;

  auto end = id_to_users_.end();
  for (auto iter = UsersBegin(def); UsersNotEnd(iter, end, def); ++iter) {
    if (!f(iter->user)) return false;
  }
  return true;
}